

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_hierarchy.h
# Opt level: O0

shared_ptr<lf::mesh::Mesh> __thiscall
lf::refinement::MeshHierarchy::getMesh(MeshHierarchy *this,size_type level)

{
  size_type sVar1;
  ostream *poVar2;
  runtime_error *this_00;
  reference pvVar3;
  uint in_EDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  undefined4 in_register_00000034;
  long lVar4;
  shared_ptr<lf::mesh::Mesh> sVar5;
  string local_228;
  allocator<char> local_201;
  string local_200;
  allocator<char> local_1d9;
  string local_1d8;
  stringstream local_1a8 [8];
  stringstream ss;
  ostream local_198 [380];
  uint local_1c;
  long lStack_18;
  size_type level_local;
  MeshHierarchy *this_local;
  
  lVar4 = CONCAT44(in_register_00000034,level);
  local_1c = in_EDX;
  lStack_18 = lVar4;
  this_local = this;
  sVar1 = std::
          vector<std::shared_ptr<lf::mesh::Mesh>,_std::allocator<std::shared_ptr<lf::mesh::Mesh>_>_>
          ::size((vector<std::shared_ptr<lf::mesh::Mesh>,_std::allocator<std::shared_ptr<lf::mesh::Mesh>_>_>
                  *)(lVar4 + 8));
  if (sVar1 <= in_EDX) {
    std::__cxx11::stringstream::stringstream(local_1a8);
    poVar2 = std::operator<<(local_198,"Level ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_1c);
    std::operator<<(poVar2," outside scope");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1d8,"level < meshes_.size()",&local_1d9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_200,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/mesh_hierarchy.h"
               ,&local_201);
    std::__cxx11::stringstream::str();
    lf::base::AssertionFailed(&local_1d8,&local_200,0xa2,&local_228);
    std::__cxx11::string::~string((string *)&local_228);
    std::__cxx11::string::~string((string *)&local_200);
    std::allocator<char>::~allocator(&local_201);
    std::__cxx11::string::~string((string *)&local_1d8);
    std::allocator<char>::~allocator(&local_1d9);
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"this code should not be reached");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pvVar3 = std::
           vector<std::shared_ptr<lf::mesh::Mesh>,_std::allocator<std::shared_ptr<lf::mesh::Mesh>_>_>
           ::at((vector<std::shared_ptr<lf::mesh::Mesh>,_std::allocator<std::shared_ptr<lf::mesh::Mesh>_>_>
                 *)(lVar4 + 8),(ulong)local_1c);
  std::shared_ptr<lf::mesh::Mesh>::shared_ptr((shared_ptr<lf::mesh::Mesh> *)this,pvVar3);
  sVar5.super___shared_ptr<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar5.super___shared_ptr<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this
  ;
  return (shared_ptr<lf::mesh::Mesh>)
         sVar5.super___shared_ptr<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

[[nodiscard]] std::shared_ptr<mesh::Mesh> getMesh(size_type level) {
    LF_VERIFY_MSG(level < meshes_.size(),
                  "Level " << level << " outside scope");
    return meshes_.at(level);
  }